

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O1

TA_RetCode TA_GetFuncInfo(TA_FuncHandle *handle,TA_FuncInfo **funcInfo)

{
  TA_RetCode TVar1;
  
  TVar1 = TA_BAD_PARAM;
  if ((handle != (TA_FuncHandle *)0x0 && funcInfo != (TA_FuncInfo **)0x0) &&
     (TVar1 = TA_INVALID_HANDLE, *handle == 0xa201b201)) {
    *funcInfo = *(TA_FuncInfo **)(handle + 2);
    TVar1 = TA_INVALID_HANDLE;
    if (*(long *)(handle + 2) != 0) {
      TVar1 = TA_SUCCESS;
    }
  }
  return TVar1;
}

Assistant:

TA_RetCode TA_GetFuncInfo(  const TA_FuncHandle *handle,
                            const TA_FuncInfo **funcInfo )
{
   const TA_FuncDef *funcDef;

   if( !funcInfo || !handle )
   {
      return TA_BAD_PARAM;
   }

   /* Validate that this is a valid funcHandle. */
   funcDef = (const TA_FuncDef *)handle;
   if( funcDef->magicNumber != TA_FUNC_DEF_MAGIC_NB )
   {
      return TA_INVALID_HANDLE;
   }

   *funcInfo = funcDef->funcInfo;  
   if( !funcDef->funcInfo )
      return TA_INVALID_HANDLE;

   return TA_SUCCESS;
}